

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.hpp
# Opt level: O1

shared_ptr<duckdb::EncryptionState,_true> __thiscall
duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLSFactory::CreateEncryptionState
          (AESStateMBEDTLSFactory *this,string *key)

{
  EncryptionUtil EVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<duckdb::EncryptionState,_true> sVar3;
  undefined1 local_31;
  EncryptionUtil local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  
  local_30._vptr_EncryptionUtil = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLS,std::allocator<duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLS>,std::__cxx11::string_const*&>
            (&local_28,(AESStateMBEDTLS **)&local_30,
             (allocator<duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLS> *)&local_31,&local_20);
  EVar1._vptr_EncryptionUtil = local_30._vptr_EncryptionUtil;
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
    }
  }
  _Var2._M_pi = extraout_RDX;
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  (this->super_EncryptionUtil)._vptr_EncryptionUtil = EVar1._vptr_EncryptionUtil;
  this[1].super_EncryptionUtil._vptr_EncryptionUtil = (_func_int **)local_28._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::EncryptionState,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var2._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::EncryptionState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::EncryptionState,_true>)
         sVar3.internal.super___shared_ptr<duckdb::EncryptionState,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

duckdb::shared_ptr<duckdb::EncryptionState> CreateEncryptionState(const std::string *key = nullptr) const override {
			return duckdb::make_shared_ptr<MbedTlsWrapper::AESStateMBEDTLS>(key);
		}